

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall capnp::List<bool,_(capnp::Kind)0>::Builder::set(Builder *this,uint index,bool value)

{
  byte *pbVar1;
  byte bVar2;
  undefined7 in_register_00000011;
  
  pbVar1 = (this->builder).ptr;
  bVar2 = (byte)index & 7;
  pbVar1[index >> 3] =
       (byte)((int)CONCAT71(in_register_00000011,value) << bVar2) |
       pbVar1[index >> 3] & ~(byte)(1 << bVar2);
  return;
}

Assistant:

inline void set(uint index, T value) {
      // Alas, it is not possible to make operator[] return a reference to which you can assign,
      // since the encoded representation does not necessarily match the compiler's representation
      // of the type.  We can't even return a clever class that implements operator T() and
      // operator=() because it will lead to surprising behavior when using type inference (e.g.
      // calling a template function with inferred argument types, or using "auto" or "decltype").

      builder.template setDataElement<T>(bounded(index) * ELEMENTS, value);
    }